

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O0

FT_Error cid_slot_load_glyph(FT_GlyphSlot cidglyph,FT_Size cidsize,FT_UInt glyph_index,
                            FT_Int32 load_flags)

{
  char cVar1;
  char cVar2;
  FT_Face pFVar3;
  long lVar4;
  bool bVar5;
  FT_Int32 FVar6;
  FT_Int32 FVar7;
  FT_Fixed FVar8;
  FT_Int32 b;
  bool local_c99;
  FT_Fixed y_scale;
  FT_Fixed x_scale;
  FT_Vector *vec;
  FT_Outline *cur;
  FT_Int n;
  FT_Glyph_Metrics *metrics;
  FT_BBox cbox;
  FT_Slot_Internal internal;
  FT_Bool must_finish_decoder;
  FT_Vector font_offset;
  FT_Matrix font_matrix;
  PSAux_Service psaux;
  FT_Bool scaled;
  FT_Bool hinting;
  CID_Face face;
  T1_DecoderRec decoder;
  FT_Error error;
  CID_GlyphSlot glyph;
  FT_Int32 load_flags_local;
  FT_UInt glyph_index_local;
  FT_Size cidsize_local;
  FT_GlyphSlot cidglyph_local;
  
  pFVar3 = cidglyph->face;
  lVar4 = pFVar3[1].face_index;
  bVar5 = false;
  if (glyph_index < (uint)pFVar3->num_glyphs) {
    glyph._0_4_ = load_flags;
    if ((load_flags & 0x400U) != 0) {
      glyph._0_4_ = load_flags | 3;
    }
    cidglyph[1].face = (FT_Face)(cidsize->metrics).x_scale;
    cidglyph[1].next = (FT_GlyphSlot)(cidsize->metrics).y_scale;
    (cidglyph->outline).n_points = 0;
    (cidglyph->outline).n_contours = 0;
    local_c99 = ((uint)glyph & 1) == 0 && ((uint)glyph & 2) == 0;
    *(bool *)&cidglyph[1].library = local_c99;
    *(bool *)((long)&cidglyph[1].library + 1) = ((uint)glyph & 1) == 0;
    cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
    decoder.cf2_instance.finalizer._4_4_ =
         (*(code *)**(undefined8 **)(lVar4 + 0x18))
                   (&face,cidglyph->face,cidsize,cidglyph,0,0,local_c99,
                    (int)(uint)glyph >> 0x10 & 0xf,cid_load_glyph);
    if (decoder.cf2_instance.finalizer._4_4_ == 0) {
      bVar5 = true;
      decoder.builder.bbox.yMax._5_1_ = ((uint)glyph & 0x400) != 0;
      decoder.cf2_instance.finalizer._4_4_ = cid_load_glyph((T1_Decoder_conflict)&face,glyph_index);
      if (decoder.cf2_instance.finalizer._4_4_ == 0) {
        cVar1 = *(char *)&cidglyph[1].library;
        cVar2 = *(char *)((long)&cidglyph[1].library + 1);
        font_offset.y = (FT_Pos)decoder.subrs_hash;
        font_offset.x = decoder.font_offset.x;
        (**(code **)(*(long *)(lVar4 + 0x18) + 8))(&face);
        bVar5 = false;
        (cidglyph->outline).flags = (cidglyph->outline).flags & 1;
        (cidglyph->outline).flags = (cidglyph->outline).flags | 4;
        if (((uint)glyph & 0x400) == 0) {
          FVar8 = FT_RoundFix(decoder.builder.left_bearing.y);
          (cidglyph->metrics).horiAdvance = FVar8 >> 0x10;
          FVar8 = FT_RoundFix(decoder.builder.left_bearing.y);
          cidglyph->linearHoriAdvance = FVar8 >> 0x10;
          cidglyph->internal->glyph_transformed = '\0';
          (cidglyph->metrics).vertAdvance =
               *(long *)&pFVar3[1].max_advance_width - pFVar3[1].bbox.yMax >> 0x10;
          cidglyph->linearVertAdvance = (cidglyph->metrics).vertAdvance;
          cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
          if ((cidsize->metrics).y_ppem < 0x18) {
            (cidglyph->outline).flags = (cidglyph->outline).flags | 0x100;
          }
          if ((((font_offset.y != 0x10000) || (decoder.font_matrix.yx != 0x10000)) ||
              (decoder.font_matrix.xx != 0)) || (decoder.font_matrix.xy != 0)) {
            FT_Outline_Transform(&cidglyph->outline,(FT_Matrix *)&font_offset.y);
            FVar6 = FT_MulFix_x86_64((FT_Int32)(cidglyph->metrics).horiAdvance,
                                     (FT_Int32)font_offset.y);
            (cidglyph->metrics).horiAdvance = (long)FVar6;
            FVar6 = FT_MulFix_x86_64((FT_Int32)(cidglyph->metrics).vertAdvance,
                                     (FT_Int32)decoder.font_matrix.yx);
            (cidglyph->metrics).vertAdvance = (long)FVar6;
          }
          if ((decoder.font_matrix.yy != 0) || (font_offset.x != 0)) {
            FT_Outline_Translate(&cidglyph->outline,decoder.font_matrix.yy,font_offset.x);
            (cidglyph->metrics).horiAdvance =
                 decoder.font_matrix.yy + (cidglyph->metrics).horiAdvance;
            (cidglyph->metrics).vertAdvance = font_offset.x + (cidglyph->metrics).vertAdvance;
          }
          if ((((uint)glyph & 1) == 0) || (cVar2 != '\0')) {
            x_scale._0_4_ = (decoder.builder.loader)->max_points;
            x_scale._4_4_ = (decoder.builder.loader)->max_contours;
            FVar6 = (FT_Int32)cidglyph[1].face;
            b = (FT_Int32)cidglyph[1].next;
            if ((cVar1 == '\0') || (decoder.builder._128_8_ == 0)) {
              for (cur._4_4_ = (int)*(short *)((long)&(decoder.builder.loader)->memory + 2);
                  0 < cur._4_4_; cur._4_4_ = cur._4_4_ + -1) {
                FVar7 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)x_scale,FVar6);
                *(long *)x_scale = (long)FVar7;
                FVar7 = FT_MulFix_x86_64((FT_Int32)*(undefined8 *)(x_scale + 8),b);
                *(long *)(x_scale + 8) = (long)FVar7;
                x_scale = x_scale + 0x10;
              }
            }
            FVar6 = FT_MulFix_x86_64((FT_Int32)(cidglyph->metrics).horiAdvance,FVar6);
            (cidglyph->metrics).horiAdvance = (long)FVar6;
            FVar6 = FT_MulFix_x86_64((FT_Int32)(cidglyph->metrics).vertAdvance,b);
            (cidglyph->metrics).vertAdvance = (long)FVar6;
          }
          FT_Outline_Get_CBox(&cidglyph->outline,(FT_BBox *)&metrics);
          (cidglyph->metrics).width = cbox.yMin - (long)metrics;
          (cidglyph->metrics).height = cbox.xMax - cbox.xMin;
          (cidglyph->metrics).horiBearingX = (FT_Pos)metrics;
          (cidglyph->metrics).horiBearingY = cbox.xMax;
          if (((uint)glyph & 0x10) != 0) {
            ft_synthesize_vertical_metrics(&cidglyph->metrics,(cidglyph->metrics).vertAdvance);
          }
        }
        else {
          cbox.yMax = (FT_Pos)cidglyph->internal;
          FVar8 = FT_RoundFix(decoder.builder.pos_y);
          (cidglyph->metrics).horiBearingX = FVar8 >> 0x10;
          FVar8 = FT_RoundFix(decoder.builder.left_bearing.y);
          (cidglyph->metrics).horiAdvance = FVar8 >> 0x10;
          *(FT_Pos *)(cbox.yMax + 0x10) = font_offset.y;
          *(FT_Fixed *)(cbox.yMax + 0x18) = decoder.font_matrix.xx;
          *(FT_Fixed *)(cbox.yMax + 0x20) = decoder.font_matrix.xy;
          *(FT_Fixed *)(cbox.yMax + 0x28) = decoder.font_matrix.yx;
          *(FT_Fixed *)(cbox.yMax + 0x30) = decoder.font_matrix.yy;
          *(FT_Pos *)(cbox.yMax + 0x38) = font_offset.x;
          *(undefined1 *)(cbox.yMax + 0xc) = 1;
        }
      }
    }
  }
  else {
    decoder.cf2_instance.finalizer._4_4_ = 6;
  }
  if (bVar5) {
    (**(code **)(*(long *)(lVar4 + 0x18) + 8))(&face);
  }
  return decoder.cf2_instance.finalizer._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_slot_load_glyph( FT_GlyphSlot  cidglyph,      /* CID_GlyphSlot */
                       FT_Size       cidsize,       /* CID_Size      */
                       FT_UInt       glyph_index,
                       FT_Int32      load_flags )
  {
    CID_GlyphSlot  glyph = (CID_GlyphSlot)cidglyph;
    FT_Error       error;
    T1_DecoderRec  decoder;
    CID_Face       face = (CID_Face)cidglyph->face;
    FT_Bool        hinting;
    FT_Bool        scaled;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;
    FT_Matrix      font_matrix;
    FT_Vector      font_offset;
    FT_Bool        must_finish_decoder = FALSE;


    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    glyph->x_scale = cidsize->metrics.x_scale;
    glyph->y_scale = cidsize->metrics.y_scale;

    cidglyph->outline.n_points   = 0;
    cidglyph->outline.n_contours = 0;

    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 &&
                       ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint      = hinting;
    glyph->scaled    = scaled;
    cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;

    error = psaux->t1_decoder_funcs->init( &decoder,
                                           cidglyph->face,
                                           cidsize,
                                           cidglyph,
                                           0, /* glyph names -- XXX */
                                           0, /* blend == 0 */
                                           hinting,
                                           FT_LOAD_TARGET_MODE( load_flags ),
                                           cid_load_glyph );
    if ( error )
      goto Exit;

    /* TODO: initialize decoder.len_buildchar and decoder.buildchar */
    /*       if we ever support CID-keyed multiple master fonts     */

    must_finish_decoder = TRUE;

    /* set up the decoder */
    decoder.builder.no_recurse = FT_BOOL(
      ( ( load_flags & FT_LOAD_NO_RECURSE ) != 0 ) );

    error = cid_load_glyph( &decoder, glyph_index );
    if ( error )
      goto Exit;

    /* copy flags back for forced scaling */
    hinting = glyph->hint;
    scaled  = glyph->scaled;

    font_matrix = decoder.font_matrix;
    font_offset = decoder.font_offset;

    /* save new glyph tables */
    psaux->t1_decoder_funcs->done( &decoder );

    must_finish_decoder = FALSE;

    /* now set the metrics -- this is rather simple, as    */
    /* the left side bearing is the xMin, and the top side */
    /* bearing the yMax                                    */
    cidglyph->outline.flags &= FT_OUTLINE_OWNER;
    cidglyph->outline.flags |= FT_OUTLINE_REVERSE_FILL;

    /* for composite glyphs, return only left side bearing and */
    /* advance width                                           */
    if ( load_flags & FT_LOAD_NO_RECURSE )
    {
      FT_Slot_Internal  internal = cidglyph->internal;


      cidglyph->metrics.horiBearingX =
        FIXED_TO_INT( decoder.builder.left_bearing.x );
      cidglyph->metrics.horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );

      internal->glyph_matrix      = font_matrix;
      internal->glyph_delta       = font_offset;
      internal->glyph_transformed = 1;
    }
    else
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &cidglyph->metrics;


      /* copy the _unscaled_ advance width */
      metrics->horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->linearHoriAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->internal->glyph_transformed = 0;

      /* make up vertical ones */
      metrics->vertAdvance        = ( face->cid.font_bbox.yMax -
                                      face->cid.font_bbox.yMin ) >> 16;
      cidglyph->linearVertAdvance = metrics->vertAdvance;

      cidglyph->format            = FT_GLYPH_FORMAT_OUTLINE;

      if ( cidsize->metrics.y_ppem < 24 )
        cidglyph->outline.flags |= FT_OUTLINE_HIGH_PRECISION;

      /* apply the font matrix, if any */
      if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
           font_matrix.xy != 0        || font_matrix.yx != 0        )
      {
        FT_Outline_Transform( &cidglyph->outline, &font_matrix );

        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                          font_matrix.xx );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                          font_matrix.yy );
      }

      if ( font_offset.x || font_offset.y )
      {
        FT_Outline_Translate( &cidglyph->outline,
                              font_offset.x,
                              font_offset.y );

        metrics->horiAdvance += font_offset.x;
        metrics->vertAdvance += font_offset.y;
      }

      if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || scaled )
      {
        /* scale the outline and the metrics */
        FT_Int       n;
        FT_Outline*  cur = decoder.builder.base;
        FT_Vector*   vec = cur->points;
        FT_Fixed     x_scale = glyph->x_scale;
        FT_Fixed     y_scale = glyph->y_scale;


        /* First of all, scale the points */
        if ( !hinting || !decoder.builder.hints_funcs )
          for ( n = cur->n_points; n > 0; n--, vec++ )
          {
            vec->x = FT_MulFix( vec->x, x_scale );
            vec->y = FT_MulFix( vec->y, y_scale );
          }

        /* Then scale the metrics */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the other metrics */
      FT_Outline_Get_CBox( &cidglyph->outline, &cbox );

      metrics->width  = cbox.xMax - cbox.xMin;
      metrics->height = cbox.yMax - cbox.yMin;

      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax;

      if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
      {
        /* make up vertical ones */
        ft_synthesize_vertical_metrics( metrics,
                                        metrics->vertAdvance );
      }
    }

  Exit:

    if ( must_finish_decoder )
      psaux->t1_decoder_funcs->done( &decoder );

    return error;
  }